

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

void __thiscall wasm::LocalScanner::doWalkFunction(LocalScanner *this,Function *func)

{
  vector<wasm::LocalInfo,_std::allocator<wasm::LocalInfo>_> *this_00;
  pointer pLVar1;
  bool bVar2;
  Index IVar3;
  uint uVar4;
  size_t sVar5;
  Type type;
  Index IVar6;
  ulong uVar7;
  
  this_00 = this->localInfo;
  sVar5 = Function::getNumLocals(func);
  std::vector<wasm::LocalInfo,_std::allocator<wasm::LocalInfo>_>::resize(this_00,sVar5);
  uVar4 = 0;
  while( true ) {
    uVar7 = (ulong)uVar4;
    sVar5 = Function::getNumLocals(func);
    if (sVar5 <= uVar7) break;
    pLVar1 = (this->localInfo->super__Vector_base<wasm::LocalInfo,_std::allocator<wasm::LocalInfo>_>
             )._M_impl.super__Vector_impl_data._M_start;
    bVar2 = Function::isParam(func,uVar4);
    IVar3 = 0;
    IVar6 = 0;
    if (bVar2) {
      type = Function::getLocalType(func,uVar4);
      IVar3 = getBitsForType(type);
      IVar6 = 0xffffffff;
    }
    pLVar1[uVar7].maxBits = IVar3;
    pLVar1[uVar7].signExtBits = IVar6;
    uVar4 = uVar4 + 1;
  }
  Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::walk
            ((Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_> *)this,
             &func->body);
  uVar4 = 0;
  while( true ) {
    uVar7 = (ulong)uVar4;
    sVar5 = Function::getNumLocals(func);
    if (sVar5 <= uVar7) break;
    pLVar1 = (this->localInfo->super__Vector_base<wasm::LocalInfo,_std::allocator<wasm::LocalInfo>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (pLVar1[uVar7].signExtBits == 0xffffffff) {
      pLVar1[uVar7].signExtBits = 0;
    }
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

void doWalkFunction(Function* func) {
    // prepare
    localInfo.resize(func->getNumLocals());
    for (Index i = 0; i < func->getNumLocals(); i++) {
      auto& info = localInfo[i];
      if (func->isParam(i)) {
        info.maxBits = getBitsForType(func->getLocalType(i)); // worst-case
        info.signExtBits = LocalInfo::kUnknown; // we will never know anything
      } else {
        info.maxBits = info.signExtBits = 0; // we are open to learning
      }
    }
    // walk
    PostWalker<LocalScanner>::doWalkFunction(func);
    // finalize
    for (Index i = 0; i < func->getNumLocals(); i++) {
      auto& info = localInfo[i];
      if (info.signExtBits == LocalInfo::kUnknown) {
        info.signExtBits = 0;
      }
    }
  }